

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TimingControl.h
# Opt level: O2

void __thiscall
slang::ast::Delay3Control::visitExprs<slang::ast::builtins::MonitorVisitor&>
          (Delay3Control *this,MonitorVisitor *visitor)

{
  Expression::visit<slang::ast::builtins::MonitorVisitor&>(this->expr1,visitor);
  if (this->expr2 != (Expression *)0x0) {
    Expression::visit<slang::ast::builtins::MonitorVisitor&>(this->expr2,visitor);
  }
  if (this->expr3 != (Expression *)0x0) {
    Expression::visit<slang::ast::builtins::MonitorVisitor&>(this->expr3,visitor);
    return;
  }
  return;
}

Assistant:

void visitExprs(TVisitor&& visitor) const {
        expr1.visit(visitor);
        if (expr2)
            expr2->visit(visitor);
        if (expr3)
            expr3->visit(visitor);
    }